

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadFd(int fd,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  htmlDocPtr pxStack_10;
  int fd_local;
  
  if (fd < 0) {
    pxStack_10 = (htmlDocPtr)0x0;
  }
  else {
    xmlInitParser();
    xmlInitParser();
    input_00 = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      pxStack_10 = (htmlDocPtr)0x0;
    }
    else {
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        pxStack_10 = (htmlDocPtr)0x0;
      }
      else {
        value = xmlNewIOInputStream(ctxt_00,input_00,XML_CHAR_ENCODING_NONE);
        if (value == (xmlParserInputPtr)0x0) {
          xmlFreeParserInputBuffer(input_00);
          xmlFreeParserCtxt(ctxt_00);
          pxStack_10 = (htmlDocPtr)0x0;
        }
        else {
          inputPush(ctxt_00,value);
          pxStack_10 = htmlDoRead(ctxt_00,URL,encoding,options,0);
        }
      }
    }
  }
  return pxStack_10;
}

Assistant:

htmlDocPtr
htmlReadFd(int fd, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (fd < 0)
        return (NULL);
    xmlInitParser();

    xmlInitParser();
    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}